

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O2

void __thiscall
mp::internal::AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::
HandleSolution(AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *this
              ,int status,CStringRef message,double *values,double *dual_values,double obj_value)

{
  uint uVar1;
  int iVar2;
  TestSolver *this_00;
  CStringRef filename;
  CStringRef filename_00;
  uint uVar3;
  Result RVar4;
  char *pcVar5;
  MemoryWriter w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [24];
  _Alloc_hider local_2a8;
  size_t local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298 [38];
  
  this_00 = (this->super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
            ).solver_;
  uVar1 = (this_00->super_Solver).super_BasicSolver.wantsol_;
  uVar3 = (this_00->super_Solver).super_BasicSolver.bool_options_;
  if ((uVar1 & 1) != 0 || (uVar3 & 2) != 0) {
    if ((((uVar3 & 2) != 0) &&
        (iVar2 = *(int *)&(this->
                          super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
                          ).field_0x84, iVar2 != 0)) &&
       (((this_00->super_Solver).super_BasicSolver.output_handler_)->has_output == false)) {
      local_2c0._8_8_ = local_2c0 + 0x10;
      local_2c0._0_8_ = &PTR__BasicMemoryWriter_0025b1f8;
      local_2a8._M_p = local_298[0]._M_local_buf + 8;
      local_2a0 = 0;
      local_298[0]._M_allocated_capacity = 500;
      local_2c0._16_8_ = &PTR_grow_0025b240;
      local_2e0._M_dataplus._M_p._4_4_ = 8;
      local_2e0._M_string_length._0_4_ = 0;
      local_2e0.field_2._M_allocated_capacity = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
      local_2e0._M_dataplus._M_p._0_4_ = iVar2;
      fmt::BasicWriter<char>::operator<<
                ((BasicWriter<char> *)local_2c0,(StrFormatSpec<char> *)&local_2e0);
      pcVar5 = fmt::BasicWriter<char>::c_str((BasicWriter<char> *)local_2c0);
      local_2e0._M_dataplus._M_p._0_4_ = (int)pcVar5;
      local_2e0._M_dataplus._M_p._4_4_ = (undefined4)((ulong)pcVar5 >> 0x20);
      BasicSolver::Print<char_const*>
                ((BasicSolver *)this_00,(CStringRef)0x1efc36,(char **)&local_2e0);
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
                ((BasicMemoryWriter<char,_std::allocator<char>_> *)local_2c0);
    }
    SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::HandleSolution
              (&this->
                super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>,
               status,message,values,dual_values,obj_value);
    uVar3 = (this_00->super_Solver).super_BasicSolver.bool_options_;
  }
  if ((uVar3 & 2) == 0) {
    if ((uVar1 & 8) == 0) {
      local_2c0._0_8_ =
           message.data_ +
           *(uint *)&(this->
                     super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
                     ).field_0x84;
      BasicSolver::Print<char_const*>
                ((BasicSolver *)this_00,(CStringRef)0x1eebdd,(char **)local_2c0);
    }
    if ((uVar1 & 2) != 0) {
      RVar4 = MockProblemBuilder::num_vars
                        (&(((this->
                            super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
                            ).builder_)->super_StrictMock<MockProblemBuilder>).
                          super_MockProblemBuilder);
      std::operator+(&local_2e0,
                     &(this->
                      super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
                      ).stub_,".col");
      filename.data_._4_4_ = local_2e0._M_dataplus._M_p._4_4_;
      filename.data_._0_4_ = (int)local_2e0._M_dataplus._M_p;
      NameProvider::NameProvider
                ((NameProvider *)local_2c0,filename,(CStringRef)0x1df4d6,(long)RVar4);
      std::__cxx11::string::~string((string *)&local_2e0);
      PrintSolution(values,RVar4,"variable","value",(NameProvider *)local_2c0);
      NameProvider::~NameProvider((NameProvider *)local_2c0);
    }
    if ((uVar1 & 4) != 0) {
      RVar4 = MockProblemBuilder::num_algebraic_cons
                        (&(((this->
                            super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
                            ).builder_)->super_StrictMock<MockProblemBuilder>).
                          super_MockProblemBuilder);
      std::operator+(&local_2e0,
                     &(this->
                      super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
                      ).stub_,".row");
      filename_00.data_._4_4_ = local_2e0._M_dataplus._M_p._4_4_;
      filename_00.data_._0_4_ = (int)local_2e0._M_dataplus._M_p;
      NameProvider::NameProvider
                ((NameProvider *)local_2c0,filename_00,(CStringRef)0x1df4ea,(long)RVar4);
      std::__cxx11::string::~string((string *)&local_2e0);
      PrintSolution(dual_values,RVar4,"constraint","dual value",(NameProvider *)local_2c0);
      NameProvider::~NameProvider((NameProvider *)local_2c0);
    }
  }
  return;
}

Assistant:

void AppSolutionHandlerImpl<Solver, PB, Writer>::HandleSolution(
    int status, fmt::CStringRef message, const double *values,
    const double *dual_values, double obj_value) {
  Solver &solver = this->solver();
  int wantsol = solver.wantsol();
  if (solver.ampl_flag() || (wantsol & Solver::WRITE_SOL_FILE) != 0) {
    // "Erase" the banner so that it is not duplicated when printing
    // the solver message.
    if (solver.ampl_flag() && banner_size_ != 0
        && !solver.output_handler()->has_output) {   // #233
      fmt::MemoryWriter w;
      w << fmt::pad("", banner_size_, '\b');
      solver.Print("{}", w.c_str());
    }
    SolutionWriterImpl<Solver, PB, Writer>::HandleSolution(
          status, message, values, dual_values, obj_value);
  }
  if (solver.ampl_flag())
    return;
  if ((wantsol & Solver::SUPPRESS_SOLVER_MSG) == 0)
    solver.Print("{}\n", message.c_str() + banner_size_);
  using internal::PrintSolution;
  if ((wantsol & Solver::PRINT_SOLUTION) != 0) {
    int num_vars = this->builder().num_vars();
    NameProvider np(this->stub() + ".col", "_svar", num_vars);
    PrintSolution(values, num_vars, "variable", "value", np);
  }
  if ((wantsol & Solver::PRINT_DUAL_SOLUTION) != 0) {
    int num_cons = this->builder().num_algebraic_cons();
    NameProvider np(this->stub() + ".row", "_scon", num_cons);
    PrintSolution(dual_values, num_cons, "constraint", "dual value", np);
  }
}